

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.h
# Opt level: O0

__sighandler_t __thiscall Condition::signal(Condition *this,int __sig,__sighandler_t __handler)

{
  Condition *extraout_RAX;
  bool bVar1;
  Condition *this_local;
  
  bVar1 = this->waitingCount != 0;
  if (bVar1) {
    this->waitingCount = this->waitingCount + -1;
    Semaphore::v(&this->w);
    this = extraout_RAX;
  }
  return (__sighandler_t)CONCAT71((int7)((ulong)this >> 8),bVar1);
}

Assistant:

bool signal() {
        if (waitingCount) {
            --waitingCount;
            w.v();
            return true;
        }//if
        else
            return false;
    }